

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O2

ostream * MinVR::operator<<(ostream *os,VRDisplayNode *p)

{
  ostream *poVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_59);
  VRDisplayNode::printNode(&local_58,p,&local_38);
  poVar1 = std::operator<<(os,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, const VRDisplayNode& p) {
    return os << p.printNode("");
  }